

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

void __thiscall QExpandingLineEdit::resizeToContents(QExpandingLineEdit *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QPoint QVar5;
  QSize QVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QFontMetrics local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (*(int *)(*(long *)(this + 0x20) + 0x1c) - *(int *)(*(long *)(this + 0x20) + 0x14)) + 1;
  if (*(int *)(this + 0x28) == -1) {
    *(int *)(this + 0x28) = iVar8;
  }
  lVar2 = *(long *)(*(long *)(this + 8) + 0x10);
  if (lVar2 != 0) {
    QVar5 = QWidget::pos((QWidget *)this);
    QVar6 = QWidget::minimumSize((QWidget *)this);
    QWidget::fontMetrics((QWidget *)local_40);
    QLineEdit::displayText((QString *)&local_58,(QLineEdit *)this);
    iVar4 = QFontMetrics::horizontalAdvance((QString *)local_40,(int)&local_58);
    iVar4 = iVar4 + QVar6.wd.m_i.m_i;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QFontMetrics::~QFontMetrics(local_40);
    lVar2 = *(long *)(lVar2 + 0x20);
    iVar1 = *(int *)(lVar2 + 0x1c);
    iVar7 = *(int *)(lVar2 + 0x14);
    bVar3 = QWidget::isRightToLeft((QWidget *)this);
    iVar8 = iVar8 + QVar5.xp.m_i.m_i;
    iVar1 = (iVar1 - (iVar7 + QVar5.xp.m_i.m_i)) + 1;
    if (bVar3) {
      iVar1 = iVar8;
    }
    iVar7 = iVar4;
    if (iVar1 < iVar4) {
      iVar7 = iVar1;
    }
    if (iVar7 <= *(int *)(this + 0x28)) {
      iVar4 = *(int *)(this + 0x28);
    }
    if (iVar1 <= iVar4) {
      iVar4 = iVar1;
    }
    if (this[0x2c] == (QExpandingLineEdit)0x1) {
      QWidget::setMaximumWidth((QWidget *)this,iVar4);
    }
    bVar3 = QWidget::isRightToLeft((QWidget *)this);
    if (bVar3) {
      QWidget::move((QWidget *)this,iVar8 - iVar4,QVar5.yp.m_i.m_i);
    }
    QWidget::resize((QWidget *)this,iVar4,
                    (*(int *)(*(long *)(this + 0x20) + 0x20) -
                    *(int *)(*(long *)(this + 0x20) + 0x18)) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QExpandingLineEdit::resizeToContents()
{
    int oldWidth = width();
    if (originalWidth == -1)
        originalWidth = oldWidth;
    if (QWidget *parent = parentWidget()) {
        QPoint position = pos();
        int hintWidth = minimumWidth() + fontMetrics().horizontalAdvance(displayText());
        int parentWidth = parent->width();
        int maxWidth = isRightToLeft() ? position.x() + oldWidth : parentWidth - position.x();
        int newWidth = qBound(qMin(originalWidth, maxWidth), hintWidth, maxWidth);
        if (widgetOwnsGeometry)
            setMaximumWidth(newWidth);
        if (isRightToLeft())
            move(position.x() - newWidth + oldWidth, position.y());
        resize(newWidth, height());
    }
}